

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iir_filter.hpp
# Opt level: O1

void __thiscall IIR_I::filter(IIR_I *this,double *data_in,double *data_out,int len)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  pdVar3 = this->m_py;
  pdVar3[1] = 1.0;
  if (0 < len) {
    pdVar4 = this->m_px;
    uVar1 = this->m_num_order;
    pdVar5 = this->m_pNum;
    pdVar6 = this->m_pDen;
    uVar2 = this->m_den_order;
    uVar9 = 0;
    do {
      *pdVar4 = data_in[uVar9];
      *pdVar3 = 0.0;
      if (-1 < (int)uVar1) {
        dVar10 = *pdVar3;
        uVar7 = 0;
        do {
          dVar10 = dVar10 + pdVar5[uVar7] * pdVar4[uVar7];
          *pdVar3 = dVar10;
          uVar7 = uVar7 + 1;
        } while (uVar1 + 1 != uVar7);
      }
      if (0 < (int)uVar2) {
        dVar10 = *pdVar3;
        uVar7 = 1;
        do {
          dVar10 = dVar10 - pdVar6[uVar7] * pdVar3[uVar7];
          *pdVar3 = dVar10;
          uVar7 = uVar7 + 1;
        } while (uVar2 + 1 != uVar7);
      }
      lVar8 = (ulong)uVar1 + 1;
      if (0 < (int)uVar1) {
        do {
          pdVar4[lVar8 + -1] = pdVar4[lVar8 + -2];
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      lVar8 = (ulong)uVar2 + 1;
      if (0 < (int)uVar2) {
        do {
          pdVar3[lVar8 + -1] = pdVar3[lVar8 + -2];
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      data_out[uVar9] = *pdVar3;
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)len);
  }
  return;
}

Assistant:

void IIR_I::filter(double data_in[], double data_out[], int len)
{
    int i, k;
    m_py[1] = 1; //修改的地方，因为公式中y[n-k]，当为第一个元素时会出现y[-1]，pcen中y[-1]会被认为为1。
    for(k = 0; k < len; k++)
    {
        m_px[0] = data_in[k];
        m_py[0] = 0.0;
        for(i = 0; i <= m_num_order; i++)
        {
            m_py[0] = m_py[0] + m_pNum[i] * m_px[i];
        }
        for(i = 1; i <= m_den_order; i++)
        {
            m_py[0] = m_py[0] - m_pDen[i] * m_py[i];
        }
        for(i = m_num_order; i >= 1; i--)
        {
            m_px[i] = m_px[i-1];
        }
        for(i = m_den_order; i >= 1; i--)
        {
            m_py[i] = m_py[i-1];
        }
        data_out[k] = m_py[0];
    }
}